

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerTest::iterate(SamplerTest *this)

{
  TestLog *log;
  int iVar1;
  undefined4 extraout_var;
  Sampler sampler;
  CallLogWrapper gl;
  ResultCollector result;
  allocator<char> local_99;
  string local_98;
  CallLogWrapper local_78;
  ResultCollector local_60;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_78,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector(&local_60,log,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  glu::TypedObjectWrapper<(glu::ObjectType)7>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)7> *)&local_98,this->m_renderCtx);
  local_78.m_enableLog = true;
  this->m_target = local_98.field_2._M_allocated_capacity._0_4_;
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,&local_78,&local_60);
  this->m_target = 0;
  tcu::ResultCollector::setTestContextResult
            (&local_60,(this->super_TestCase).super_TestNode.m_testCtx);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&local_98);
  tcu::ResultCollector::~ResultCollector(&local_60);
  glu::CallLogWrapper::~CallLogWrapper(&local_78);
  return STOP;
}

Assistant:

SamplerTest::IterateResult SamplerTest::iterate (void)
{
	glu::CallLogWrapper		gl		(m_renderCtx.getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	glu::Sampler			sampler	(m_renderCtx);

	gl.enableLogging(true);

	m_target = *sampler;
	test(gl, result);
	m_target = 0;

	result.setTestContextResult(m_testCtx);
	return STOP;
}